

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_GetImportMeta(JSContext *ctx,JSModuleDef *m)

{
  int64_t iVar1;
  JSRefCountHeader *p;
  JSValue JVar2;
  
  iVar1 = (m->meta_obj).tag;
  if ((int)iVar1 == 3) {
    JVar2 = JS_NewObjectProto(ctx,(JSValue)(ZEXT816(2) << 0x40));
    if ((int)JVar2.tag == 6) {
      return (JSValue)(ZEXT816(6) << 0x40);
    }
    m->meta_obj = JVar2;
  }
  else {
    JVar2.tag = iVar1;
    JVar2.u.ptr = (m->meta_obj).u.ptr;
  }
  if (0xfffffff4 < (uint)JVar2.tag) {
    *(int *)JVar2.u.ptr = *JVar2.u.ptr + 1;
  }
  return JVar2;
}

Assistant:

JSValue JS_GetImportMeta(JSContext *ctx, JSModuleDef *m)
{
    JSValue obj;
    /* allocate meta_obj only if requested to save memory */
    obj = m->meta_obj;
    if (JS_IsUndefined(obj)) {
        obj = JS_NewObjectProto(ctx, JS_NULL);
        if (JS_IsException(obj))
            return JS_EXCEPTION;
        m->meta_obj = obj;
    }
    return JS_DupValue(ctx, obj);
}